

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::formata(CBString *this,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  int iVar2;
  bstring b;
  size_t sVar3;
  CBStringException *pCVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator local_1b9;
  CBStringException bstr__cppwrapper_exception;
  va_list arglist;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((this->super_tagbstring).mlen < 1) {
    std::__cxx11::string::string((string *)&local_108,"CBString::Write protection error",&local_1b9)
    ;
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    pCVar4 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar4,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar4,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (fmt == (char *)0x0) {
    operator+=(this,"<NULL>");
    std::__cxx11::string::string
              ((string *)&local_128,"CBString::CBString::formata (NULL, ...) is erroneous.",
               &local_1b9);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    pCVar4 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar4,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar4,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  b = bfromcstr(anon_var_dwarf_2f785 + 0x10);
  if (b == (bstring)0x0) {
    std::__cxx11::string::string
              ((string *)&local_148,"CBString::CBString::format out of memory.",&local_1b9);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    pCVar4 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar4,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar4,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  sVar3 = strlen(fmt);
  iVar2 = (int)sVar3 * 2;
  iVar5 = 0x10;
  if (0x10 < iVar2) {
    iVar5 = iVar2;
  }
  while( true ) {
    iVar2 = balloc(b,iVar5 + 2);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&local_168,"CBString::CBString::format out of memory.",&local_1b9);
      CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      pCVar4 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar4,&bstr__cppwrapper_exception);
      __cxa_throw(pCVar4,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    arglist[0].reg_save_area = local_e8;
    arglist[0].overflow_arg_area = &stack0x00000008;
    arglist[0].gp_offset = 0x10;
    arglist[0].fp_offset = 0x30;
    iVar2 = vsnprintf((char *)b->data,(long)(iVar5 + 1),fmt,arglist);
    b->data[iVar5] = '\0';
    sVar3 = strlen((char *)b->data);
    b->slen = (int)sVar3;
    if ((int)sVar3 < iVar5) break;
    bVar1 = iVar5 < iVar2;
    iVar5 = iVar5 * 2;
    if (bVar1) {
      iVar5 = iVar2;
    }
  }
  operator+=(this,b);
  bdestroy(b);
  return;
}

Assistant:

void CBString::formata (const char * fmt, ...) {
	bstring b;
	va_list arglist;
	int r, n;

	if (mlen <= 0) bstringThrow ("Write protection error");
	if (fmt == NULL) {
		*this += "<NULL>";
		bstringThrow ("CBString::formata (NULL, ...) is erroneous.");
	} else {

		if ((b = bfromcstr ("")) == NULL) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
			bstringThrow ("CBString::format out of memory.");
#else
			*this += "<NULL>";
#endif
		} else {
			if ((n = (int) (2 * (strlen) (fmt))) < START_VSNBUFF) n = START_VSNBUFF;
			for (;;) {
				if (BSTR_OK != balloc (b, n + 2)) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
					bstringThrow ("CBString::format out of memory.");
#else
					b = bformat ("<NULL>");
					break;
#endif
				}

				va_start (arglist, fmt);
				exvsnprintf (r, (char *) b->data, n + 1, fmt, arglist);
				va_end (arglist);

				b->data[n] = '\0';
				b->slen = (int) (strlen) ((char *) b->data);

				if (b->slen < n) break;
				if (r > n) n = r; else n += n;
			}
			*this += *b;
			bdestroy (b);
		}
	}
}